

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall AbstractContentContext::j(AbstractContentContext *this,int inLineJoinStyle)

{
  EStatusCode EVar1;
  allocator<char> local_41;
  string local_40;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteInteger
            (&this->mPrimitiveWriter,(long)inLineJoinStyle,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"j",&local_41);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::j(int inLineJoinStyle)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteInteger(inLineJoinStyle);
	mPrimitiveWriter.WriteKeyword("j");
	return GetCurrentStatusCode();
}